

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcore.cpp
# Opt level: O0

result * baryonyx::solve(result *__return_storage_ptr__,context_ptr *ctx,raw_problem *rawpb)

{
  bool bVar1;
  pointer pcVar2;
  type pcVar3;
  type pcVar4;
  problem local_228;
  byte local_119;
  problem local_118;
  raw_problem *local_20;
  raw_problem *rawpb_local;
  context_ptr *ctx_local;
  
  local_20 = rawpb;
  rawpb_local = (raw_problem *)ctx;
  ctx_local = (context_ptr *)__return_storage_ptr__;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)ctx);
  if (bVar1) {
    pcVar2 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                       ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)rawpb_local)
    ;
    local_119 = 0;
    if ((pcVar2->parameters).preprocessor == all) {
      pcVar3 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator*
                         ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                          rawpb_local);
      pcVar4 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator*
                         ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                          rawpb_local);
      preprocess(&local_118,pcVar4,local_20);
      local_119 = 1;
      itm::solve(__return_storage_ptr__,pcVar3,&local_118);
    }
    else {
      pcVar3 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator*
                         ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                          rawpb_local);
      pcVar4 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator*
                         ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                          rawpb_local);
      unpreprocess(&local_228,pcVar4,local_20);
      itm::solve(__return_storage_ptr__,pcVar3,&local_228);
      problem::~problem(&local_228);
    }
    if ((local_119 & 1) != 0) {
      problem::~problem(&local_118);
    }
  }
  else {
    result::result(__return_storage_ptr__,empty_context);
  }
  return __return_storage_ptr__;
}

Assistant:

result
solve(const baryonyx::context_ptr& ctx, const raw_problem& rawpb)
{
    if (ctx)
        return (ctx->parameters.preprocessor ==
                solver_parameters::preprocessor_options::all)
                 ? itm::solve(*ctx, preprocess(*ctx, rawpb))
                 : itm::solve(*ctx, unpreprocess(*ctx, rawpb));

    return result{ baryonyx::result_status::empty_context };
}